

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O0

void LoadExtByName(char *extensionName)

{
  int iVar1;
  sfglx_StrToExtMap *psVar2;
  int numFailed;
  sfglx_StrToExtMap *entry;
  char *extensionName_local;
  
  psVar2 = FindExtEntry(extensionName);
  if (psVar2 != (sfglx_StrToExtMap *)0x0) {
    if (psVar2->LoadExtension == (PFN_LOADFUNCPOINTERS)0x0) {
      *psVar2->extensionVariable = 1;
    }
    else {
      iVar1 = (*psVar2->LoadExtension)();
      if (iVar1 == 0) {
        *psVar2->extensionVariable = 1;
      }
      else {
        *psVar2->extensionVariable = iVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

static void LoadExtByName(const char* extensionName)
{
    sfglx_StrToExtMap* entry = NULL;
    entry = FindExtEntry(extensionName);
    if (entry)
    {
        if (entry->LoadExtension)
        {
            int numFailed = entry->LoadExtension();
            if (numFailed == 0)
            {
                *(entry->extensionVariable) = sfglx_LOAD_SUCCEEDED;
            }
            else
            {
                *(entry->extensionVariable) = sfglx_LOAD_SUCCEEDED + numFailed;
            }
        }
        else
        {
            *(entry->extensionVariable) = sfglx_LOAD_SUCCEEDED;
        }
    }
}